

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getpart.c
# Opt level: O3

int getpart(char **outbuf,size_t *outlen,char *main,char *sub,FILE *stream)

{
  ushort *puVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  byte *__s;
  size_t sVar5;
  ushort **ppuVar6;
  byte *pbVar7;
  byte *pbVar8;
  ulong uVar9;
  byte bVar10;
  long lVar11;
  size_t uznum;
  long lVar12;
  bool bVar13;
  size_t outalloc;
  char ptag [80];
  char csub [80];
  char cmain [80];
  char patt [80];
  char couter [80];
  int local_204;
  int local_200;
  size_t local_1e8;
  byte *local_1e0;
  char *local_1d8;
  undefined8 local_1d0;
  char local_1c8 [80];
  char local_178 [80];
  char local_128 [80];
  char local_d8 [80];
  char local_88 [88];
  
  local_1e8 = 0x100;
  *outlen = 0;
  pcVar4 = (char *)(*Curl_cmalloc)(0x100);
  *outbuf = pcVar4;
  if (pcVar4 == (char *)0x0) {
    return -1;
  }
  *pcVar4 = '\0';
  local_d8[0] = '\0';
  local_1c8[0] = '\0';
  local_178[0] = '\0';
  local_128[0] = '\0';
  local_88[0] = '\0';
  bVar2 = true;
  __s = (byte *)0x0;
  uznum = 0;
  local_200 = 0;
  local_204 = 0;
  local_1d8 = sub;
  local_1d0 = main;
LAB_00103e64:
  do {
    if (__s == (byte *)0x0) {
      uznum = 0x80;
      __s = (byte *)(*Curl_cmalloc)(0x80);
      if (__s == (byte *)0x0) {
        __s = (byte *)0x0;
LAB_0010429a:
        (*Curl_cfree)(__s);
        iVar3 = -1;
        goto LAB_001042a8;
      }
    }
    iVar3 = curlx_uztosi(uznum);
    pcVar4 = fgets((char *)__s,iVar3,(FILE *)stream);
    if (pcVar4 == (char *)0x0) {
LAB_00104301:
      (*Curl_cfree)(__s);
      return 0;
    }
    uVar9 = 0;
    do {
      sVar5 = strlen((char *)(__s + uVar9));
      uVar9 = sVar5 + uVar9;
      if (__s[uVar9 - 1] == 10) goto LAB_00103f19;
      pbVar7 = __s;
      if (uznum - 1 <= uVar9) {
        uznum = uznum * 2;
        pbVar7 = (byte *)(*Curl_crealloc)(__s,uznum);
        if (pbVar7 == (byte *)0x0) goto LAB_0010429a;
      }
      __s = pbVar7;
      iVar3 = curlx_uztosi(uznum - uVar9);
      pcVar4 = fgets((char *)(__s + uVar9),iVar3,(FILE *)stream);
    } while (pcVar4 != (char *)0x0);
    if (uVar9 == 0) goto LAB_00104301;
LAB_00103f19:
    bVar10 = *__s;
    if (bVar10 == 0) goto LAB_00103f55;
    ppuVar6 = __ctype_b_loc();
    puVar1 = *ppuVar6;
    lVar11 = 2;
    lVar12 = 0;
LAB_00103f32:
    if ((*(byte *)((long)puVar1 + (ulong)bVar10 * 2 + 1) & 0x20) != 0) break;
    if (bVar10 != 0x3c) goto LAB_00103f55;
    bVar10 = __s[lVar11 + -1];
    if (bVar10 != 0x2f) {
      pbVar7 = __s + -lVar12;
      if (bVar2) goto LAB_00103fc3;
      goto LAB_00103f5f;
    }
    pbVar7 = __s + -lVar12 + 2;
    bVar10 = __s[lVar11];
    while (((bVar10 != 0 && (bVar10 != 0x3e)) && ((puVar1[bVar10] & 0x2000) == 0))) {
      bVar10 = pbVar7[1];
      pbVar7 = pbVar7 + 1;
    }
    if (0x4f < (long)(pbVar7 + (lVar12 - (long)__s) + -2)) {
      iVar3 = -2;
      goto LAB_0010428d;
    }
    memcpy(local_1c8,__s + lVar11,(size_t)(pbVar7 + (lVar12 - (long)__s) + -2));
    pbVar7[(long)(local_1c8 + ((lVar12 + -2) - (long)__s))] = 0;
    if (local_204 == 1) {
      iVar3 = strcmp(local_88,local_1c8);
      local_204 = 1;
      if (iVar3 != 0) goto LAB_00103f55;
      local_88[0] = '\0';
      local_204 = 0;
      if (!bVar2) goto LAB_00104301;
    }
    else {
      if (local_204 != 2) {
        if (local_204 == 3) {
          iVar3 = strcmp(local_178,local_1c8);
          local_204 = 3;
          if (iVar3 == 0) {
            local_178[0] = '\0';
            local_204 = 2;
            goto LAB_00104184;
          }
        }
        goto LAB_00103f55;
      }
      iVar3 = strcmp(local_128,local_1c8);
      local_204 = 2;
      if (iVar3 != 0) goto LAB_00103f55;
      local_128[0] = '\0';
      local_204 = 1;
LAB_00104184:
      if (!bVar2) {
        if ((local_200 != 0) && (iVar3 = decodedata(outbuf,outlen), iVar3 != 0)) {
          return -1;
        }
        goto LAB_00104301;
      }
    }
  } while( true );
  bVar10 = __s[lVar11 + -1];
  lVar12 = lVar12 + -1;
  lVar11 = lVar11 + 1;
  if (bVar10 == 0) goto LAB_00103f55;
  goto LAB_00103f32;
LAB_00103fc3:
  while (((pbVar8 = pbVar7 + 1, bVar10 != 0 && (bVar10 != 0x3e)) && ((puVar1[bVar10] & 0x2000) == 0)
         )) {
    bVar10 = pbVar7[2];
    pbVar7 = pbVar8;
  }
  iVar3 = -2;
  if ((long)(pbVar8 + (lVar12 - (long)__s) + -1) < 0x50) {
    local_1e0 = pbVar8;
    memcpy(local_1c8,__s + lVar11 + -1,(size_t)(pbVar8 + (lVar12 - (long)__s) + -1));
    local_1e0[(long)(local_1c8 + lVar12 + (-1 - (long)__s))] = 0;
    if ((local_1c8[0] != '!') && (local_1c8[0] != '?')) {
      bVar10 = *local_1e0;
      pbVar7 = local_1e0;
      while (bVar10 != 0) {
        if ((*(byte *)((long)puVar1 + (ulong)bVar10 * 2 + 1) & 0x20) == 0) goto LAB_001040ef;
        pbVar8 = pbVar7 + 1;
        pbVar7 = pbVar7 + 1;
        bVar10 = *pbVar8;
      }
      bVar10 = 0;
LAB_001040ef:
      sVar5 = 0;
      while ((bVar10 != 0 && (bVar10 != 0x3e))) {
        lVar11 = sVar5 + 1;
        sVar5 = sVar5 + 1;
        bVar10 = pbVar7[lVar11];
      }
      if (0x4f < (long)sVar5) goto LAB_0010428d;
      memcpy(local_d8,pbVar7,sVar5);
      local_d8[sVar5] = '\0';
      if (local_204 == 0) {
        local_204 = 1;
        pcVar4 = local_88;
      }
      else {
        if (local_204 == 2) {
          strcpy(local_178,local_1c8);
          iVar3 = strcmp(local_128,local_1d0);
          local_204 = 3;
          bVar2 = true;
          if ((iVar3 == 0) && (iVar3 = strcmp(local_178,local_1d8), iVar3 == 0)) {
            pcVar4 = strstr(local_d8,"base64=");
            if (pcVar4 != (char *)0x0) {
              local_200 = 1;
            }
            local_204 = 3;
            bVar2 = false;
          }
          goto LAB_00103e64;
        }
        bVar13 = local_204 != 1;
        local_204 = 3;
        if (bVar13) {
LAB_00103f55:
          if (bVar2) goto LAB_00103e64;
LAB_00103f5f:
          iVar3 = appenddata(outbuf,outlen,&local_1e8,(char *)__s,local_200);
          if (iVar3 == 0) goto LAB_00103e64;
          iVar3 = -1;
          goto LAB_0010428d;
        }
        local_204 = 2;
        pcVar4 = local_128;
      }
      strcpy(pcVar4,local_1c8);
    }
    bVar2 = true;
    goto LAB_00103e64;
  }
LAB_0010428d:
  (*Curl_cfree)(__s);
LAB_001042a8:
  (*Curl_cfree)(*outbuf);
  *outbuf = (char *)0x0;
  *outlen = 0;
  return iVar3;
}

Assistant:

int getpart(char **outbuf, size_t *outlen,
            const char *main, const char *sub, FILE *stream)
{
# define MAX_TAG_LEN 79
  char couter[MAX_TAG_LEN+1]; /* current outermost section */
  char cmain[MAX_TAG_LEN+1];  /* current main section */
  char csub[MAX_TAG_LEN+1];   /* current sub section */
  char ptag[MAX_TAG_LEN+1];   /* potential tag */
  char patt[MAX_TAG_LEN+1];   /* potential attributes */
  char *buffer = NULL;
  char *ptr;
  char *end;
  union {
    ssize_t sig;
     size_t uns;
  } len;
  size_t bufsize = 0;
  size_t outalloc = 256;
  int in_wanted_part = 0;
  int base64 = 0;
  int error;

  enum {
    STATE_OUTSIDE = 0,
    STATE_OUTER   = 1,
    STATE_INMAIN  = 2,
    STATE_INSUB   = 3,
    STATE_ILLEGAL = 4
  } state = STATE_OUTSIDE;

  *outlen = 0;
  *outbuf = malloc(outalloc);
  if(!*outbuf)
    return GPE_OUT_OF_MEMORY;
  *(*outbuf) = '\0';

  couter[0] = cmain[0] = csub[0] = ptag[0] = patt[0] = '\0';

  while((error = readline(&buffer, &bufsize, stream)) == GPE_OK) {

    ptr = buffer;
    EAT_SPACE(ptr);

    if('<' != *ptr) {
      if(in_wanted_part) {
        show(("=> %s", buffer));
        error = appenddata(outbuf, outlen, &outalloc, buffer, base64);
        if(error)
          break;
      }
      continue;
    }

    ptr++;

    if('/' == *ptr) {
      /*
      ** closing section tag
      */

      ptr++;
      end = ptr;
      EAT_WORD(end);
      if((len.sig = end - ptr) > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(ptag, ptr, len.uns);
      ptag[len.uns] = '\0';

      if((STATE_INSUB == state) && !strcmp(csub, ptag)) {
        /* end of current sub section */
        state = STATE_INMAIN;
        csub[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;

          /* Do we need to base64 decode the data? */
          if(base64) {
            error = decodedata(outbuf, outlen);
            if(error)
              return error;
          }
          break;
        }
      }
      else if((STATE_INMAIN == state) && !strcmp(cmain, ptag)) {
        /* end of current main section */
        state = STATE_OUTER;
        cmain[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;

          /* Do we need to base64 decode the data? */
          if(base64) {
            error = decodedata(outbuf, outlen);
            if(error)
              return error;
          }
          break;
        }
      }
      else if((STATE_OUTER == state) && !strcmp(couter, ptag)) {
        /* end of outermost file section */
        state = STATE_OUTSIDE;
        couter[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;
          break;
        }
      }

    }
    else if(!in_wanted_part) {
      /*
      ** opening section tag
      */

      /* get potential tag */
      end = ptr;
      EAT_WORD(end);
      if((len.sig = end - ptr) > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(ptag, ptr, len.uns);
      ptag[len.uns] = '\0';

      /* ignore comments, doctypes and xml declarations */
      if(('!' == ptag[0]) || ('?' == ptag[0])) {
        show(("* ignoring (%s)", buffer));
        continue;
      }

      /* get all potential attributes */
      ptr = end;
      EAT_SPACE(ptr);
      end = ptr;
      while(*end && ('>' != *end))
        end++;
      if((len.sig = end - ptr) > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(patt, ptr, len.uns);
      patt[len.uns] = '\0';

      if(STATE_OUTSIDE == state) {
        /* outermost element (<testcase>) */
        strcpy(couter, ptag);
        state = STATE_OUTER;
        continue;
      }
      else if(STATE_OUTER == state) {
        /* start of a main section */
        strcpy(cmain, ptag);
        state = STATE_INMAIN;
        continue;
      }
      else if(STATE_INMAIN == state) {
        /* start of a sub section */
        strcpy(csub, ptag);
        state = STATE_INSUB;
        if(!strcmp(cmain, main) && !strcmp(csub, sub)) {
          /* start of wanted part */
          in_wanted_part = 1;
          if(strstr(patt, "base64="))
              /* bit rough test, but "mostly" functional, */
              /* treat wanted part data as base64 encoded */
              base64 = 1;
        }
        continue;
      }

    }

    if(in_wanted_part) {
      show(("=> %s", buffer));
      error = appenddata(outbuf, outlen, &outalloc, buffer, base64);
      if(error)
        break;
    }

  } /* while */

  free(buffer);

  if(error != GPE_OK) {
    if(error == GPE_END_OF_FILE)
      error = GPE_OK;
    else {
      free(*outbuf);
      *outbuf = NULL;
      *outlen = 0;
    }
  }

  return error;
}